

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

int64_t __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
::get_int64_value(basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
                  *this,error_code *ec)

{
  cbor_major_type cVar1;
  byte bVar2;
  bool bVar3;
  char_result<unsigned_char> cVar4;
  type_conflict3 tVar5;
  type_conflict4 tVar6;
  uint8_t *first;
  type_conflict2 tVar7;
  uint64_t uVar8;
  ulong uVar9;
  error_code *in_RSI;
  value_type *in_RDI;
  uint64_t x_3;
  type_conflict2 x_2;
  uint8_t buf_2 [8];
  type_conflict4 x_1;
  uint8_t buf_1 [4];
  type_conflict3 x;
  uint8_t buf [2];
  uint8_t b;
  uint8_t info;
  cbor_major_type major_type;
  char_result<unsigned_char> ch;
  int64_t val;
  binary_iterator_source<(anonymous_namespace)::MyIterator> *in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  binary_iterator_source<(anonymous_namespace)::MyIterator> *in_stack_ffffffffffffffb0;
  uint64_t uVar10;
  basic_cbor_parser<jsoncons::binary_iterator_source<(anonymous_namespace)::MyIterator>,_std::allocator<char>_>
  *in_stack_ffffffffffffffb8;
  byte local_25;
  uint8_t local_22;
  uint64_t local_20;
  uint64_t local_8;
  
  local_20 = 0;
  cVar4 = binary_iterator_source<(anonymous_namespace)::MyIterator>::peek(in_stack_ffffffffffffff88)
  ;
  if (((ushort)cVar4 & 0x100) == 0) {
    local_22 = cVar4.value;
    cVar1 = get_major_type(local_22);
    bVar2 = get_additional_information_value(local_22);
    if (cVar1 == unsigned_integer) {
      uVar8 = get_uint64_value(in_stack_ffffffffffffffb8,(error_code *)in_stack_ffffffffffffffb0);
      bVar3 = std::error_code::operator_cast_to_bool(in_RSI);
      if (bVar3) {
        return 0;
      }
      uVar10 = uVar8;
      uVar9 = std::numeric_limits<long>::max();
      if (uVar8 <= uVar9) {
        local_20 = uVar10;
      }
    }
    else if (cVar1 == negative_integer) {
      binary_iterator_source<(anonymous_namespace)::MyIterator>::ignore
                ((binary_iterator_source<(anonymous_namespace)::MyIterator> *)
                 CONCAT17(1,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
      first = (uint8_t *)(ulong)bVar2;
      switch(first) {
      case (uint8_t *)0x0:
      case (uint8_t *)0x1:
      case (uint8_t *)0x2:
      case (uint8_t *)0x3:
      case (uint8_t *)0x4:
      case (uint8_t *)0x5:
      case (uint8_t *)0x6:
      case (uint8_t *)0x7:
      case (uint8_t *)0x8:
      case (uint8_t *)0x9:
      case (uint8_t *)0xa:
      case (uint8_t *)0xb:
      case (uint8_t *)0xc:
      case (uint8_t *)0xd:
      case (uint8_t *)0xe:
      case (uint8_t *)0xf:
      case (uint8_t *)0x10:
      case (uint8_t *)0x11:
      case (uint8_t *)0x12:
      case (uint8_t *)0x13:
      case (uint8_t *)0x14:
      case (uint8_t *)0x15:
      case (uint8_t *)0x16:
      case (uint8_t *)0x17:
        local_20 = (uint64_t)(char)(-1 - bVar2);
        break;
      case (uint8_t *)0x18:
        tVar7 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
                read<std::input_iterator_tag>
                          (in_stack_ffffffffffffffb0,in_RDI,
                           CONCAT17(cVar1,in_stack_ffffffffffffffa0));
        if (tVar7 == 0) {
          std::error_code::operator=
                    ((error_code *)CONCAT17(cVar1,in_stack_ffffffffffffffa0),
                     (cbor_errc)((ulong)first >> 0x20));
          in_RDI[8] = '\0';
          return 0;
        }
        local_20 = -(ulong)local_25 - 1;
        break;
      case (uint8_t *)0x19:
        tVar7 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
                read<std::input_iterator_tag>
                          (in_stack_ffffffffffffffb0,in_RDI,
                           CONCAT17(cVar1,in_stack_ffffffffffffffa0));
        if (tVar7 != 2) {
          std::error_code::operator=
                    ((error_code *)CONCAT17(cVar1,in_stack_ffffffffffffffa0),
                     (cbor_errc)((ulong)first >> 0x20));
          in_RDI[8] = '\0';
          return 0;
        }
        tVar5 = binary::big_to_native<unsigned_short,jsoncons::detail::endian>
                          (first,in_stack_ffffffffffffff90);
        local_20 = -(ulong)tVar5 - 1;
        break;
      case (uint8_t *)0x1a:
        tVar7 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
                read<std::input_iterator_tag>
                          (in_stack_ffffffffffffffb0,in_RDI,
                           CONCAT17(cVar1,in_stack_ffffffffffffffa0));
        if (tVar7 != 4) {
          std::error_code::operator=
                    ((error_code *)CONCAT17(cVar1,in_stack_ffffffffffffffa0),
                     (cbor_errc)((ulong)first >> 0x20));
          in_RDI[8] = '\0';
          return 0;
        }
        tVar6 = binary::big_to_native<unsigned_int,jsoncons::detail::endian>
                          (first,in_stack_ffffffffffffff90);
        local_20 = -(ulong)tVar6 - 1;
        break;
      case (uint8_t *)0x1b:
        tVar7 = binary_iterator_source<(anonymous_namespace)::MyIterator>::
                read<std::input_iterator_tag>
                          (in_stack_ffffffffffffffb0,in_RDI,
                           CONCAT17(cVar1,in_stack_ffffffffffffffa0));
        if (tVar7 != 8) {
          std::error_code::operator=
                    ((error_code *)CONCAT17(cVar1,in_stack_ffffffffffffffa0),
                     (cbor_errc)((ulong)first >> 0x20));
          in_RDI[8] = '\0';
          return 0;
        }
        tVar7 = binary::big_to_native<unsigned_long,jsoncons::detail::endian>
                          (first,in_stack_ffffffffffffff90);
        local_20 = -tVar7 - 1;
      }
    }
    local_8 = local_20;
  }
  else {
    std::error_code::operator=
              ((error_code *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
               (cbor_errc)(in_stack_ffffffffffffff98 >> 0x20));
    in_RDI[8] = '\0';
    local_8 = 0;
  }
  return local_8;
}

Assistant:

int64_t get_int64_value(std::error_code& ec)
    {
        int64_t val = 0;

        auto ch = source_.peek();
        if (ch.eof)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return val;
        }

        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(ch.value);
        uint8_t info = get_additional_information_value(ch.value);
        switch (major_type)
        {
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
                source_.ignore(1);
                switch (info)
                {
                    case JSONCONS_EXT_CBOR_0x00_0x17: // 0x00..0x17 (0..23)
                    {
                        val = static_cast<int8_t>(- 1 - info);
                        break;
                    }
                    case 0x18: // Negative integer (one-byte uint8_t follows)
                        {
                            uint8_t b;
                            if (source_.read(&b, 1) == 0)
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            val = static_cast<int64_t>(-1) - static_cast<int64_t>(b);
                            break;
                        }

                    case 0x19: // Negative integer -1-n (two-byte uint16_t follows)
                        {
                            uint8_t buf[sizeof(uint16_t)];
                            if (source_.read(buf, sizeof(uint16_t)) != sizeof(uint16_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint16_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1a: // Negative integer -1-n (four-byte uint32_t follows)
                        {
                            uint8_t buf[sizeof(uint32_t)];
                            if (source_.read(buf, sizeof(uint32_t)) != sizeof(uint32_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint32_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- x;
                            break;
                        }

                    case 0x1b: // Negative integer -1-n (eight-byte uint64_t follows)
                        {
                            uint8_t buf[sizeof(uint64_t)];
                            if (source_.read(buf, sizeof(uint64_t)) != sizeof(uint64_t))
                            {
                                ec = cbor_errc::unexpected_eof;
                                more_ = false;
                                return val;
                            }
                            auto x = binary::big_to_native<uint64_t>(buf, sizeof(buf));
                            val = static_cast<int64_t>(-1)- static_cast<int64_t>(x);
                            break;
                        }
                }
                break;

                case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
                {
                    uint64_t x = get_uint64_value(ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        return 0;
                    }
                    if (x <= static_cast<uint64_t>((std::numeric_limits<int64_t>::max)()))
                    {
                        val = x;
                    }
                    else
                    {
                        // error;
                    }
                    
                    break;
                }
                break;
            default:
                break;
        }

        return val;
    }